

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void define_pmu_regs(ARMCPU_conflict1 *cpu)

{
  byte bVar1;
  _Bool _Var2;
  char *mem;
  CPWriteFn_conflict *mem_00;
  CPWriteFn_conflict *mem_01;
  CPWriteFn_conflict *mem_02;
  undefined1 local_598 [8];
  ARMCPRegInfo_conflict v81_pmu_regs [3];
  undefined1 local_3f8 [8];
  ARMCPRegInfo_conflict pmev_regs [5];
  char *pmevtyper_el0_name;
  char *pmevtyper_name;
  char *pmevcntr_el0_name;
  char *pmevcntr_name;
  ARMCPRegInfo_conflict pmcr64;
  ARMCPRegInfo_conflict pmcr;
  uint pmcrn;
  uint i;
  ARMCPU_conflict1 *cpu_local;
  
  memcpy(&pmcr64.orig_writefn,&DAT_01707438,0x88);
  pmevcntr_name = "PMCR_EL0";
  pmcr64.name._0_1_ = 0;
  pmcr64.name._1_1_ = 9;
  pmcr64.name._2_1_ = 0xc;
  pmcr64.name._3_1_ = 3;
  pmcr64.name._4_1_ = 3;
  pmcr64.name._5_1_ = 0;
  pmcr64.cp = '\x01';
  pmcr64.crn = '\0';
  pmcr64.crm = '\0';
  pmcr64.opc0 = '\0';
  pmcr64.opc1 = '@';
  pmcr64.opc2 = '\0';
  pmcr64._14_2_ = 0;
  pmcr64.state = 0xff;
  pmcr64.type = 0;
  pmcr64.access = 0;
  pmcr64.secure = 0;
  pmcr64.opaque = (void *)(ulong)(cpu->midr & 0xff000000 | 0x2040);
  pmcr64.resetvalue = 0x470;
  memset(&pmcr64.fieldoffset,0,0x10);
  pmcr64.bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
  pmcr64.accessfn = (CPAccessFn_conflict *)0x0;
  pmcr64.readfn = pmcr_write;
  pmcr64.writefn = (CPWriteFn_conflict *)0x0;
  pmcr64.raw_readfn = raw_write;
  pmcr64.raw_writefn = (CPWriteFn_conflict *)0x0;
  pmcr64.resetfn = (CPResetFn_conflict *)0x0;
  pmcr64.orig_readfn = (CPReadFn_conflict *)0x0;
  define_one_arm_cp_reg(cpu,(ARMCPRegInfo_conflict *)&pmcr64.orig_writefn);
  define_one_arm_cp_reg(cpu,(ARMCPRegInfo_conflict *)&pmevcntr_name);
  for (pmcr.orig_writefn._4_4_ = 0; pmcr.orig_writefn._4_4_ < 4;
      pmcr.orig_writefn._4_4_ = pmcr.orig_writefn._4_4_ + 1) {
    mem = g_strdup_printf("PMEVCNTR%d",(ulong)pmcr.orig_writefn._4_4_);
    mem_00 = (CPWriteFn_conflict *)g_strdup_printf("PMEVCNTR%d_EL0",(ulong)pmcr.orig_writefn._4_4_);
    mem_01 = (CPWriteFn_conflict *)g_strdup_printf("PMEVTYPER%d",(ulong)pmcr.orig_writefn._4_4_);
    mem_02 = (CPWriteFn_conflict *)g_strdup_printf("PMEVTYPER%d_EL0");
    pmev_regs[0].name._0_1_ = 0xf;
    pmev_regs[0].name._1_1_ = 0xe;
    pmev_regs[0].name._2_1_ = (byte)(pmcr.orig_writefn._4_4_ >> 3) & 3 | 8;
    pmev_regs[0].name._3_1_ = 0;
    pmev_regs[0].name._4_1_ = 0;
    bVar1 = (byte)pmcr.orig_writefn._4_4_;
    pmev_regs[0].name._5_1_ = bVar1 & 7;
    pmev_regs[0].cp = '\0';
    pmev_regs[0].crn = '\0';
    pmev_regs[0].crm = '\0';
    pmev_regs[0].opc0 = '\0';
    pmev_regs[0].opc1 = '`';
    pmev_regs[0].opc2 = '\0';
    pmev_regs[0]._14_2_ = 0;
    pmev_regs[0].state = 0xff;
    pmev_regs[0].type = 0;
    pmev_regs[0].access = 0;
    pmev_regs[0].secure = 0;
    pmev_regs[0].opaque = (void *)0x0;
    pmev_regs[0].resetvalue = 0;
    local_3f8 = (undefined1  [8])mem;
    memset(&pmev_regs[0].fieldoffset,0,0x10);
    pmev_regs[0].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    pmev_regs[0].accessfn = pmevcntr_readfn;
    pmev_regs[0].readfn = pmevcntr_writefn;
    pmev_regs[0].writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[0].raw_readfn = (CPReadFn_conflict *)0x0;
    pmev_regs[0].raw_writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[0].resetfn = (CPResetFn_conflict *)0x0;
    pmev_regs[0].orig_readfn = (CPReadFn_conflict *)0x0;
    pmev_regs[1].name._0_1_ = 0;
    pmev_regs[1].name._1_1_ = 0xe;
    pmev_regs[1].name._2_1_ = (byte)(pmcr.orig_writefn._4_4_ >> 3) & 3 | 8;
    pmev_regs[1].name._3_1_ = 3;
    pmev_regs[1].name._4_1_ = 3;
    pmev_regs[1].name._5_1_ = bVar1 & 7;
    pmev_regs[1].cp = '\x01';
    pmev_regs[1].crn = '\0';
    pmev_regs[1].crm = '\0';
    pmev_regs[1].opc0 = '\0';
    pmev_regs[1].opc1 = '@';
    pmev_regs[1].opc2 = '\0';
    pmev_regs[1]._14_2_ = 0;
    pmev_regs[1].state = 0xff;
    pmev_regs[1].type = 0;
    pmev_regs[1].access = 0;
    pmev_regs[1].secure = 0;
    pmev_regs[1].opaque = (void *)0x0;
    pmev_regs[1].resetvalue = 0;
    pmev_regs[0].orig_writefn = mem_00;
    memset(&pmev_regs[1].fieldoffset,0,0x10);
    pmev_regs[1].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    pmev_regs[1].accessfn = pmevcntr_readfn;
    pmev_regs[1].readfn = pmevcntr_writefn;
    pmev_regs[1].writefn = pmevcntr_rawread;
    pmev_regs[1].raw_readfn = pmevcntr_rawwrite;
    pmev_regs[1].raw_writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[1].resetfn = (CPResetFn_conflict *)0x0;
    pmev_regs[1].orig_readfn = (CPReadFn_conflict *)0x0;
    pmev_regs[2].name._0_1_ = 0xf;
    pmev_regs[2].name._1_1_ = 0xe;
    pmev_regs[2].name._2_1_ = (byte)(pmcr.orig_writefn._4_4_ >> 3) & 3 | 0xc;
    pmev_regs[2].name._3_1_ = 0;
    pmev_regs[2].name._4_1_ = 0;
    pmev_regs[2].name._5_1_ = bVar1 & 7;
    pmev_regs[2].cp = '\0';
    pmev_regs[2].crn = '\0';
    pmev_regs[2].crm = '\0';
    pmev_regs[2].opc0 = '\0';
    pmev_regs[2].opc1 = '`';
    pmev_regs[2].opc2 = '\0';
    pmev_regs[2]._14_2_ = 0;
    pmev_regs[2].state = 0xff;
    pmev_regs[2].type = 0;
    pmev_regs[2].access = 0;
    pmev_regs[2].secure = 0;
    pmev_regs[2].opaque = (void *)0x0;
    pmev_regs[2].resetvalue = 0;
    pmev_regs[1].orig_writefn = mem_01;
    memset(&pmev_regs[2].fieldoffset,0,0x10);
    pmev_regs[2].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    pmev_regs[2].accessfn = pmevtyper_readfn;
    pmev_regs[2].readfn = pmevtyper_writefn;
    pmev_regs[2].writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[2].raw_readfn = (CPReadFn_conflict *)0x0;
    pmev_regs[2].raw_writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[2].resetfn = (CPResetFn_conflict *)0x0;
    pmev_regs[2].orig_readfn = (CPReadFn_conflict *)0x0;
    pmev_regs[3].name._0_1_ = 0;
    pmev_regs[3].name._1_1_ = 0xe;
    pmev_regs[3].name._2_1_ = (byte)(pmcr.orig_writefn._4_4_ >> 3) & 3 | 0xc;
    pmev_regs[3].name._3_1_ = 3;
    pmev_regs[3].name._4_1_ = 3;
    pmev_regs[3].name._5_1_ = bVar1 & 7;
    pmev_regs[3].cp = '\x01';
    pmev_regs[3].crn = '\0';
    pmev_regs[3].crm = '\0';
    pmev_regs[3].opc0 = '\0';
    pmev_regs[3].opc1 = '@';
    pmev_regs[3].opc2 = '\0';
    pmev_regs[3]._14_2_ = 0;
    pmev_regs[3].state = 0xff;
    pmev_regs[3].type = 0;
    pmev_regs[3].access = 0;
    pmev_regs[3].secure = 0;
    pmev_regs[3].opaque = (void *)0x0;
    pmev_regs[3].resetvalue = 0;
    pmev_regs[2].orig_writefn = mem_02;
    memset(&pmev_regs[3].fieldoffset,0,0x10);
    pmev_regs[3].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    pmev_regs[3].accessfn = pmevtyper_readfn;
    pmev_regs[3].readfn = pmevtyper_writefn;
    pmev_regs[3].writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[3].raw_readfn = pmevtyper_rawwrite;
    pmev_regs[3].raw_writefn = (CPWriteFn_conflict *)0x0;
    pmev_regs[3].resetfn = (CPResetFn_conflict *)0x0;
    pmev_regs[3].orig_readfn = (CPReadFn_conflict *)0x0;
    memset(&pmev_regs[3].orig_writefn,0,0x88);
    pmev_regs[4].opc1 = 0xff;
    pmev_regs[4].opc2 = 0xff;
    pmev_regs[4]._14_2_ = 0xf;
    define_arm_cp_regs(cpu,(ARMCPRegInfo_conflict *)local_3f8);
    g_free(mem);
    g_free(mem_00);
    g_free(mem_01);
    g_free(mem_02);
  }
  _Var2 = isar_feature_aa32_pmu_8_1(&cpu->isar);
  if (_Var2) {
    memset(local_598,0,0x198);
    local_598 = (undefined1  [8])0x136c743;
    v81_pmu_regs[0].name._0_1_ = 0xf;
    v81_pmu_regs[0].name._1_1_ = 9;
    v81_pmu_regs[0].name._2_1_ = 0xe;
    v81_pmu_regs[0].name._5_1_ = 4;
    v81_pmu_regs[0].cp = '\0';
    v81_pmu_regs[0].crn = '\0';
    v81_pmu_regs[0].crm = '\0';
    v81_pmu_regs[0].opc0 = '\0';
    v81_pmu_regs[0].opc1 = '\x02';
    v81_pmu_regs[0].opc2 = '\0';
    v81_pmu_regs[0]._14_2_ = 0;
    v81_pmu_regs[0].state = 0xaa;
    v81_pmu_regs[0].opaque = (void *)extract64(cpu->pmceid0,0x20,0x20);
    v81_pmu_regs[0].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    v81_pmu_regs[0].orig_writefn = (CPWriteFn_conflict *)anon_var_dwarf_155b2e;
    v81_pmu_regs[1].name._0_1_ = 0xf;
    v81_pmu_regs[1].name._1_1_ = 9;
    v81_pmu_regs[1].name._2_1_ = 0xe;
    v81_pmu_regs[1].name._5_1_ = 5;
    v81_pmu_regs[1].cp = '\0';
    v81_pmu_regs[1].crn = '\0';
    v81_pmu_regs[1].crm = '\0';
    v81_pmu_regs[1].opc0 = '\0';
    v81_pmu_regs[1].opc1 = '\x02';
    v81_pmu_regs[1].opc2 = '\0';
    v81_pmu_regs[1]._14_2_ = 0;
    v81_pmu_regs[1].state = 0xaa;
    v81_pmu_regs[1].opaque = (void *)extract64(cpu->pmceid1,0x20,0x20);
    v81_pmu_regs[1].bank_fieldoffsets[1] = (ptrdiff_t)pmreg_access;
    v81_pmu_regs[2].opc1 = 0xff;
    v81_pmu_regs[2].opc2 = 0xff;
    v81_pmu_regs[2]._14_2_ = 0xf;
    define_arm_cp_regs(cpu,(ARMCPRegInfo_conflict *)local_598);
  }
  _Var2 = isar_feature_any_pmu_8_4(&cpu->isar);
  if (_Var2) {
    define_one_arm_cp_reg(cpu,&define_pmu_regs::v84_pmmir);
  }
  return;
}

Assistant:

static void define_pmu_regs(ARMCPU *cpu)
{
    /*
     * v7 performance monitor control register: same implementor
     * field as main ID register, and we implement four counters in
     * addition to the cycle count register.
     */
    unsigned int i, pmcrn = 4;
    ARMCPRegInfo pmcr = {
        .name = "PMCR", .cp = 15, .crn = 9, .crm = 12, .opc1 = 0, .opc2 = 0,
        .access = PL0_RW,
        .type = ARM_CP_IO | ARM_CP_ALIAS,
        .fieldoffset = offsetoflow32(CPUARMState, cp15.c9_pmcr),
        .accessfn = pmreg_access, .writefn = pmcr_write,
        .raw_writefn = raw_write,
    };
    ARMCPRegInfo pmcr64 = {
        .name = "PMCR_EL0", .state = ARM_CP_STATE_AA64,
        .opc0 = 3, .opc1 = 3, .crn = 9, .crm = 12, .opc2 = 0,
        .access = PL0_RW, .accessfn = pmreg_access,
        .type = ARM_CP_IO,
        .fieldoffset = offsetof(CPUARMState, cp15.c9_pmcr),
        .resetvalue = (cpu->midr & 0xff000000) | (pmcrn << PMCRN_SHIFT) |
                      PMCRLC,
        .writefn = pmcr_write, .raw_writefn = raw_write,
    };
    define_one_arm_cp_reg(cpu, &pmcr);
    define_one_arm_cp_reg(cpu, &pmcr64);
    for (i = 0; i < pmcrn; i++) {
        char *pmevcntr_name = g_strdup_printf("PMEVCNTR%d", i);
        char *pmevcntr_el0_name = g_strdup_printf("PMEVCNTR%d_EL0", i);
        char *pmevtyper_name = g_strdup_printf("PMEVTYPER%d", i);
        char *pmevtyper_el0_name = g_strdup_printf("PMEVTYPER%d_EL0", i);
        ARMCPRegInfo pmev_regs[] = {
            { .name = pmevcntr_name, .cp = 15, .crn = 14,
              .crm = 8 | (3 & (i >> 3)), .opc1 = 0, .opc2 = i & 7,
              .access = PL0_RW, .type = ARM_CP_IO | ARM_CP_ALIAS,
              .readfn = pmevcntr_readfn, .writefn = pmevcntr_writefn,
              .accessfn = pmreg_access },
            { .name = pmevcntr_el0_name, .state = ARM_CP_STATE_AA64,
              .opc0 = 3, .opc1 = 3, .crn = 14, .crm = 8 | (3 & (i >> 3)),
              .opc2 = i & 7, .access = PL0_RW, .accessfn = pmreg_access,
              .type = ARM_CP_IO,
              .readfn = pmevcntr_readfn, .writefn = pmevcntr_writefn,
              .raw_readfn = pmevcntr_rawread,
              .raw_writefn = pmevcntr_rawwrite },
            { .name = pmevtyper_name, .cp = 15, .crn = 14,
              .crm = 12 | (3 & (i >> 3)), .opc1 = 0, .opc2 = i & 7,
              .access = PL0_RW, .type = ARM_CP_IO | ARM_CP_ALIAS,
              .readfn = pmevtyper_readfn, .writefn = pmevtyper_writefn,
              .accessfn = pmreg_access },
            { .name = pmevtyper_el0_name, .state = ARM_CP_STATE_AA64,
              .opc0 = 3, .opc1 = 3, .crn = 14, .crm = 12 | (3 & (i >> 3)),
              .opc2 = i & 7, .access = PL0_RW, .accessfn = pmreg_access,
              .type = ARM_CP_IO,
              .readfn = pmevtyper_readfn, .writefn = pmevtyper_writefn,
              .raw_writefn = pmevtyper_rawwrite },
            REGINFO_SENTINEL
        };
        define_arm_cp_regs(cpu, pmev_regs);
        g_free(pmevcntr_name);
        g_free(pmevcntr_el0_name);
        g_free(pmevtyper_name);
        g_free(pmevtyper_el0_name);
    }
    if (cpu_isar_feature(aa32_pmu_8_1, cpu)) {
        ARMCPRegInfo v81_pmu_regs[] = {
            { .name = "PMCEID2", .state = ARM_CP_STATE_AA32,
              .cp = 15, .opc1 = 0, .crn = 9, .crm = 14, .opc2 = 4,
              .access = PL0_R, .accessfn = pmreg_access, .type = ARM_CP_CONST,
              .resetvalue = extract64(cpu->pmceid0, 32, 32) },
            { .name = "PMCEID3", .state = ARM_CP_STATE_AA32,
              .cp = 15, .opc1 = 0, .crn = 9, .crm = 14, .opc2 = 5,
              .access = PL0_R, .accessfn = pmreg_access, .type = ARM_CP_CONST,
              .resetvalue = extract64(cpu->pmceid1, 32, 32) },
            REGINFO_SENTINEL
        };
        define_arm_cp_regs(cpu, v81_pmu_regs);
    }
    if (cpu_isar_feature(any_pmu_8_4, cpu)) {
        static const ARMCPRegInfo v84_pmmir = {
            .name = "PMMIR_EL1", .state = ARM_CP_STATE_BOTH,
            .opc0 = 3, .opc1 = 0, .crn = 9, .crm = 14, .opc2 = 6,
            .access = PL1_R, .accessfn = pmreg_access, .type = ARM_CP_CONST,
            .resetvalue = 0
        };
        define_one_arm_cp_reg(cpu, &v84_pmmir);
    }
}